

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O0

DFSIt<dg::vr::VRCodeGraph::SimpleVisit> * __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::operator++
          (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *this)

{
  bool bVar1;
  VRLocation *loc;
  VREdge *edge;
  DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *in_RDI;
  VRLocation *next;
  VREdge *nextEdge;
  uint nextSize;
  VREdge *prevEdge;
  uint index;
  VRLocation *current;
  tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*> *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint uVar2;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  VRLocation *in_stack_ffffffffffffffb0;
  uint local_14;
  
  do {
    do {
      bVar1 = std::
              vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
              ::empty((vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                       *)in_RDI);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return in_RDI;
      }
      loc = (VRLocation *)
            std::
            vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
            ::back((vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      std::tie<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>
                ((VRLocation **)loc,
                 (uint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (VREdge **)in_stack_ffffffffffffff88);
      std::tuple<dg::vr::VRLocation*&,unsigned_int&,dg::vr::VREdge*&>::operator=
                ((tuple<dg::vr::VRLocation_*&,_unsigned_int_&,_dg::vr::VREdge_*&> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
      std::
      vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
      ::pop_back((vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                  *)0x1f1ed5);
      if (in_RDI->dir == FORWARD) {
        in_stack_ffffffffffffff94 = VRLocation::succsSize((VRLocation *)0x1f1eea);
        uVar2 = in_stack_ffffffffffffff94;
      }
      else {
        in_stack_ffffffffffffff94 = VRLocation::predsSize((VRLocation *)0x1f1efa);
        uVar2 = in_stack_ffffffffffffff94;
      }
      while( true ) {
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 & 0xffffff;
        if (local_14 < uVar2) {
          getNextEdge(in_RDI,loc,in_stack_ffffffffffffff94);
          bVar1 = isIrrelevant(in_RDI,(VREdge *)loc);
          in_stack_ffffffffffffff90 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90);
        }
        if ((char)(in_stack_ffffffffffffff90 >> 0x18) == '\0') break;
        local_14 = local_14 + 1;
      }
    } while (uVar2 <= local_14);
    std::
    vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
    ::emplace_back<dg::vr::VRLocation*&,unsigned_int,dg::vr::VREdge*&>
              ((vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
                *)in_stack_ffffffffffffffb0,
               (VRLocation **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (uint *)in_RDI,(VREdge **)loc);
    edge = getNextEdge(in_RDI,loc,in_stack_ffffffffffffff94);
    in_stack_ffffffffffffffb0 = getNextLocation(in_RDI,edge);
    SimpleVisit::find(&in_RDI->super_SimpleVisit,loc);
    bVar1 = SimpleVisit::shouldVisit(in_stack_ffffffffffffffb0);
  } while (!bVar1);
  std::
  vector<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>,std::allocator<std::tuple<dg::vr::VRLocation*,unsigned_int,dg::vr::VREdge*>>>
  ::emplace_back<dg::vr::VRLocation*&,int,dg::vr::VREdge*&>
            ((vector<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
              *)in_stack_ffffffffffffffb0,(VRLocation **)(ulong)in_stack_ffffffffffffffa8,
             (int *)in_RDI,(VREdge **)loc);
  return in_RDI;
}

Assistant:

DFSIt &operator++() {
            while (!stack.empty()) {
                VRLocation *current;
                unsigned index;
                VREdge *prevEdge;
                std::tie(current, index, prevEdge) = stack.back();
                stack.pop_back();

                unsigned nextSize = dir == Dir::FORWARD ? current->succsSize()
                                                        : current->predsSize();
                // do not explore if there is no target or if target was already
                // explored or if is in other function

                while (index < nextSize &&
                       isIrrelevant(getNextEdge(current, index)))
                    ++index;

                if (index >= nextSize)
                    continue;
                stack.emplace_back(current, index + 1, prevEdge);

                VREdge *nextEdge = getNextEdge(current, index);
                VRLocation *next = getNextLocation(nextEdge);

                Visit::find(next);
                if (Visit::shouldVisit(next)) {
                    stack.emplace_back(next, 0, nextEdge);
                    break;
                }
            }
            return *this;
        }